

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O0

void __thiscall spvtools::opt::LoopFusion::Fuse(LoopFusion *this)

{
  IRContext *pIVar1;
  pointer ppLVar2;
  value_type *this_00;
  bool bVar3;
  Op OVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  Analysis AVar7;
  BasicBlock *pBVar8;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> *pUVar9;
  reference pvVar10;
  BasicBlock *pBVar11;
  CFG *this_01;
  DefUseManager *pDVar12;
  Instruction *pIVar13;
  reference ppLVar14;
  BasicBlockListTy *pBVar15;
  reference puVar16;
  Loop *pLVar17;
  reference ppIVar18;
  Instruction *inst;
  iterator __end2_6;
  iterator __begin2_6;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_6;
  _Node_iterator_base<unsigned_int,_false> _Stack_2e0;
  uint block;
  iterator __end2_5;
  iterator __begin2_5;
  BasicBlockListTy *__range2_5;
  BasicBlockListTy loop_1_blocks;
  Loop *child_loop_1;
  iterator __end2_4;
  iterator __begin2_4;
  vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *__range2_4;
  Loop *child_loop;
  iterator __end2_3;
  iterator __begin2_3;
  Loop *__range2_3;
  vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> loops_to_add_remove;
  LoopDescriptor *ld;
  DefUseManager *def_use_mgr;
  CFG *cfg;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  instr_to_delete;
  function<void_(spvtools::opt::Instruction_*)> local_200;
  anon_class_8_1_8991fb9c local_1e0;
  function<void_(spvtools::opt::Instruction_*)> local_1d8;
  reference local_1b8;
  Instruction **phi_instruction;
  iterator __end2_2;
  iterator __begin2_2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_2;
  function<void_(spvtools::opt::Instruction_*)> local_190;
  reference local_170;
  Instruction **it;
  iterator __end2_1;
  iterator __begin2_1;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *__range2_1;
  Instruction *local_148;
  Instruction *instruction;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  instructions_to_move;
  function<void_(spvtools::opt::Instruction_*)> local_108;
  anon_class_8_1_8991fb9c local_e8;
  function<void_(spvtools::opt::Instruction_*)> local_e0;
  DebugScope local_c0;
  function<void_(unsigned_int_*)> local_b8;
  anon_class_8_1_a4230fa8 local_98;
  function<void_(unsigned_int_*)> local_90;
  iterator local_70;
  reference local_60;
  value_type *last_block_of_0;
  reference local_48;
  value_type *last_block_of_1;
  reference local_30;
  value_type *first_block_of_1;
  BasicBlock *condition_block_of_0;
  uint32_t continue_0;
  uint32_t continue_1;
  uint32_t condition_1;
  uint32_t header_1;
  LoopFusion *this_local;
  
  _condition_1 = this;
  bVar3 = AreCompatible(this);
  if (!bVar3) {
    __assert_fail("AreCompatible() && \"Can\'t fuse, loops aren\'t compatible\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp"
                  ,0x216,"void spvtools::opt::LoopFusion::Fuse()");
  }
  bVar3 = IsLegal(this);
  if (bVar3) {
    pBVar8 = Loop::GetHeaderBlock(this->loop_1_);
    continue_1 = BasicBlock::id(pBVar8);
    pBVar8 = Loop::FindConditionBlock(this->loop_1_);
    continue_0 = BasicBlock::id(pBVar8);
    pBVar8 = Loop::GetContinueBlock(this->loop_1_);
    condition_block_of_0._4_4_ = BasicBlock::id(pBVar8);
    pBVar8 = Loop::GetContinueBlock(this->loop_0_);
    condition_block_of_0._0_4_ = BasicBlock::id(pBVar8);
    first_block_of_1 = Loop::FindConditionBlock(this->loop_0_);
    _last_block_of_1 = Function::FindBlock(this->containing_function_,continue_0);
    pUVar9 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&last_block_of_1);
    local_30 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(pUVar9);
    _last_block_of_0 = Function::FindBlock(this->containing_function_,condition_block_of_0._4_4_);
    pUVar9 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator--
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&last_block_of_0);
    local_48 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(pUVar9);
    local_70 = Function::FindBlock(this->containing_function_,(uint32_t)condition_block_of_0);
    pUVar9 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator--(&local_70);
    pvVar10 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*(pUVar9);
    local_98.first_block_of_1 = local_30;
    local_60 = pvVar10;
    std::function<void(unsigned_int*)>::function<spvtools::opt::LoopFusion::Fuse()::__0,void>
              ((function<void(unsigned_int*)> *)&local_90,&local_98);
    BasicBlock::ForEachSuccessorLabel(pvVar10,&local_90);
    std::function<void_(unsigned_int_*)>::~function(&local_90);
    pvVar10 = local_48;
    local_c0 = (DebugScope)this;
    std::function<void(unsigned_int*)>::function<spvtools::opt::LoopFusion::Fuse()::__1,void>
              ((function<void(unsigned_int*)> *)&local_b8,(anon_class_8_1_8991fb9c *)&local_c0);
    BasicBlock::ForEachSuccessorLabel(pvVar10,&local_b8);
    std::function<void_(unsigned_int_*)>::~function(&local_b8);
    pBVar8 = Loop::GetHeaderBlock(this->loop_0_);
    local_e8.this = this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::LoopFusion::Fuse()::__2,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_e0,&local_e8);
    BasicBlock::ForEachInst(pBVar8,&local_e0,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_e0);
    this_00 = first_block_of_1;
    instructions_to_move.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::LoopFusion::Fuse()::__3,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_108,
               (anon_class_8_1_8991fb9c *)
               &instructions_to_move.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    BasicBlock::ForEachInst(this_00,&local_108,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_108);
    memset(&__range2,0,0x18);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&__range2);
    Loop::GetHeaderBlock(this->loop_1_);
    BasicBlock::begin((BasicBlock *)&__end2);
    BasicBlock::end((BasicBlock *)&instruction);
    while (bVar3 = utils::operator!=(&__end2.super_iterator,
                                     (iterator_template<spvtools::opt::Instruction> *)&instruction),
          bVar3) {
      local_148 = utils::IntrusiveList<spvtools::opt::Instruction>::
                  iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
      OVar4 = Instruction::opcode(local_148);
      if ((OVar4 == OpPhi) && (local_148 != this->induction_1_)) {
        __range2_1 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)local_148;
        std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
        push_back((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)&__range2,(value_type *)&__range2_1);
      }
      InstructionList::iterator::operator++(&__end2);
    }
    __end2_1 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range2);
    it = (Instruction **)
         std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
         end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&it), bVar3) {
      local_170 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                  ::operator*(&__end2_1);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
                (&(*local_170)->super_IntrusiveNodeBase<spvtools::opt::Instruction>);
      utils::IntrusiveNodeBase<spvtools::opt::Instruction>::InsertBefore
                (&(*local_170)->super_IntrusiveNodeBase<spvtools::opt::Instruction>,
                 this->induction_0_);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_1);
    }
    pBVar8 = Loop::GetHeaderBlock(this->loop_0_);
    __range2_2 = (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::LoopFusion::Fuse()::__4,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_190,
               (anon_class_8_1_8991fb9c *)&__range2_2);
    BasicBlock::ForEachPhiInst(pBVar8,&local_190,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_190);
    __end2_2 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&__range2);
    phi_instruction =
         (Instruction **)
         std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
         end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
             &__range2);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&phi_instruction), bVar3) {
      local_1b8 = __gnu_cxx::
                  __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                  ::operator*(&__end2_2);
      pIVar1 = this->context_;
      pIVar13 = *local_1b8;
      pBVar8 = Loop::GetHeaderBlock(this->loop_0_);
      IRContext::set_instr_block(pIVar1,pIVar13,pBVar8);
      pDVar12 = IRContext::get_def_use_mgr(this->context_);
      analysis::DefUseManager::AnalyzeInstUse(pDVar12,*local_1b8);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_2);
    }
    pIVar1 = this->context_;
    uVar5 = Instruction::result_id(this->induction_1_);
    uVar6 = Instruction::result_id(this->induction_0_);
    IRContext::ReplaceAllUsesWith(pIVar1,uVar5,uVar6);
    pBVar8 = Loop::GetMergeBlock(this->loop_0_);
    local_1e0.this = this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::LoopFusion::Fuse()::__5,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_1d8,&local_1e0);
    BasicBlock::ForEachPhiInst(pBVar8,&local_1d8,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_1d8);
    pBVar8 = Loop::GetMergeBlock(this->loop_1_);
    instr_to_delete.
    super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)first_block_of_1;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::LoopFusion::Fuse()::__6,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_200,
               (anon_class_8_1_b8e40cdc *)
               &instr_to_delete.
                super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    BasicBlock::ForEachPhiInst(pBVar8,&local_200,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_200);
    Function::MoveBasicBlockToAfter
              (this->containing_function_,(uint32_t)condition_block_of_0,local_48);
    memset(&cfg,0,0x18);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&cfg);
    pBVar8 = Loop::GetPreHeaderBlock(this->loop_1_);
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&cfg,pBVar8);
    pBVar8 = Loop::GetHeaderBlock(this->loop_1_);
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&cfg,pBVar8);
    pBVar8 = Loop::FindConditionBlock(this->loop_1_);
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&cfg,pBVar8);
    pBVar8 = Loop::GetContinueBlock(this->loop_1_);
    anon_unknown_21::AddInstructionsInBlock
              ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                *)&cfg,pBVar8);
    pBVar8 = Loop::GetMergeBlock(this->loop_0_);
    pBVar11 = Loop::GetPreHeaderBlock(this->loop_1_);
    if (pBVar8 != pBVar11) {
      pBVar8 = Loop::GetMergeBlock(this->loop_0_);
      anon_unknown_21::AddInstructionsInBlock
                ((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&cfg,pBVar8);
    }
    this_01 = IRContext::cfg(this->context_);
    pBVar8 = Loop::GetPreHeaderBlock(this->loop_1_);
    CFG::ForgetBlock(this_01,pBVar8);
    pBVar8 = Loop::GetHeaderBlock(this->loop_1_);
    CFG::ForgetBlock(this_01,pBVar8);
    pBVar8 = Loop::FindConditionBlock(this->loop_1_);
    CFG::ForgetBlock(this_01,pBVar8);
    pBVar8 = Loop::GetContinueBlock(this->loop_1_);
    CFG::ForgetBlock(this_01,pBVar8);
    pBVar8 = Loop::GetMergeBlock(this->loop_0_);
    pBVar11 = Loop::GetPreHeaderBlock(this->loop_1_);
    if (pBVar8 != pBVar11) {
      pBVar8 = Loop::GetMergeBlock(this->loop_0_);
      CFG::ForgetBlock(this_01,pBVar8);
    }
    uVar5 = BasicBlock::id(local_60);
    pBVar8 = Loop::GetContinueBlock(this->loop_0_);
    uVar6 = BasicBlock::id(pBVar8);
    CFG::RemoveEdge(this_01,uVar5,uVar6);
    uVar5 = BasicBlock::id(local_60);
    uVar6 = BasicBlock::id(local_30);
    CFG::AddEdge(this_01,uVar5,uVar6);
    uVar5 = BasicBlock::id(local_48);
    pBVar8 = Loop::GetContinueBlock(this->loop_0_);
    uVar6 = BasicBlock::id(pBVar8);
    CFG::AddEdge(this_01,uVar5,uVar6);
    pBVar8 = Loop::GetContinueBlock(this->loop_0_);
    uVar5 = BasicBlock::id(pBVar8);
    pBVar8 = Loop::GetHeaderBlock(this->loop_1_);
    uVar6 = BasicBlock::id(pBVar8);
    CFG::AddEdge(this_01,uVar5,uVar6);
    uVar5 = BasicBlock::id(first_block_of_1);
    pBVar8 = Loop::GetMergeBlock(this->loop_1_);
    uVar6 = BasicBlock::id(pBVar8);
    CFG::AddEdge(this_01,uVar5,uVar6);
    pDVar12 = IRContext::get_def_use_mgr(this->context_);
    pIVar13 = BasicBlock::terminator(local_60);
    analysis::DefUseManager::AnalyzeInstUse(pDVar12,pIVar13);
    pIVar13 = BasicBlock::terminator(local_48);
    analysis::DefUseManager::AnalyzeInstUse(pDVar12,pIVar13);
    pBVar8 = Loop::GetHeaderBlock(this->loop_0_);
    pIVar13 = BasicBlock::GetLoopMergeInst(pBVar8);
    analysis::DefUseManager::AnalyzeInstUse(pDVar12,pIVar13);
    pIVar13 = BasicBlock::terminator(first_block_of_1);
    analysis::DefUseManager::AnalyzeInstUse(pDVar12,pIVar13);
    loops_to_add_remove.
    super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)IRContext::GetLoopDescriptor(this->context_,this->containing_function_);
    memset(&__range2_3,0,0x18);
    std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::vector
              ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&__range2_3)
    ;
    pLVar17 = this->loop_1_;
    __end2_3 = Loop::begin(pLVar17);
    child_loop = (Loop *)Loop::end(pLVar17);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                               *)&child_loop), bVar3) {
      ppLVar14 = __gnu_cxx::
                 __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                 ::operator*(&__end2_3);
      __range2_4 = (vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)
                   *ppLVar14;
      std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
                ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)
                 &__range2_3,(value_type *)&__range2_4);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
      ::operator++(&__end2_3);
    }
    __end2_4 = std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::begin
                         ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)
                          &__range2_3);
    child_loop_1 = (Loop *)std::
                           vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::
                           end((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                                *)&__range2_3);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_4,
                              (__normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                               *)&child_loop_1), bVar3) {
      ppLVar14 = __gnu_cxx::
                 __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
                 ::operator*(&__end2_4);
      loop_1_blocks._M_h._M_single_bucket = (__node_base_ptr)*ppLVar14;
      Loop::RemoveChildLoop(this->loop_1_,(Loop *)loop_1_blocks._M_h._M_single_bucket);
      Loop::AddNestedLoop(this->loop_0_,(Loop *)loop_1_blocks._M_h._M_single_bucket);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
      ::operator++(&__end2_4);
    }
    pBVar15 = Loop::GetBlocks(this->loop_1_);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&__range2_5,pBVar15);
    __end2_5 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)&__range2_5);
    _Stack_2e0._M_cur =
         (__node_type *)
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&__range2_5);
    while (bVar3 = std::__detail::operator!=
                             (&__end2_5.super__Node_iterator_base<unsigned_int,_false>,
                              &stack0xfffffffffffffd20), bVar3) {
      puVar16 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*(&__end2_5);
      uVar5 = *puVar16;
      Loop::RemoveBasicBlock(this->loop_1_,uVar5);
      if (((uVar5 != continue_1) && (uVar5 != continue_0)) && (uVar5 != condition_block_of_0._4_4_))
      {
        Loop::AddBasicBlock(this->loop_0_,uVar5);
        pLVar17 = LoopDescriptor::operator[]
                            ((LoopDescriptor *)
                             loops_to_add_remove.
                             super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar5);
        if (pLVar17 == this->loop_1_) {
          LoopDescriptor::SetBasicBlockToLoop
                    ((LoopDescriptor *)
                     loops_to_add_remove.
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar5,this->loop_0_);
        }
      }
      pLVar17 = LoopDescriptor::operator[]
                          ((LoopDescriptor *)
                           loops_to_add_remove.
                           super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar5);
      if (pLVar17 == this->loop_1_) {
        LoopDescriptor::ForgetBasicBlock
                  ((LoopDescriptor *)
                   loops_to_add_remove.
                   super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,uVar5);
      }
      std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++(&__end2_5);
    }
    pLVar17 = this->loop_1_;
    pBVar8 = Loop::GetPreHeaderBlock(this->loop_1_);
    uVar5 = BasicBlock::id(pBVar8);
    Loop::RemoveBasicBlock(pLVar17,uVar5);
    ppLVar2 = loops_to_add_remove.
              super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
    pBVar8 = Loop::GetPreHeaderBlock(this->loop_1_);
    uVar5 = BasicBlock::id(pBVar8);
    LoopDescriptor::ForgetBasicBlock((LoopDescriptor *)ppLVar2,uVar5);
    pBVar8 = Loop::GetMergeBlock(this->loop_0_);
    pBVar11 = Loop::GetPreHeaderBlock(this->loop_1_);
    if (pBVar8 != pBVar11) {
      pLVar17 = this->loop_0_;
      pBVar8 = Loop::GetMergeBlock(this->loop_0_);
      uVar5 = BasicBlock::id(pBVar8);
      Loop::RemoveBasicBlock(pLVar17,uVar5);
      ppLVar2 = loops_to_add_remove.
                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      pBVar8 = Loop::GetMergeBlock(this->loop_0_);
      uVar5 = BasicBlock::id(pBVar8);
      LoopDescriptor::ForgetBasicBlock((LoopDescriptor *)ppLVar2,uVar5);
    }
    pLVar17 = this->loop_0_;
    pBVar8 = Loop::GetMergeBlock(this->loop_1_);
    Loop::SetMergeBlock(pLVar17,pBVar8);
    Loop::ClearBlocks(this->loop_1_);
    LoopDescriptor::RemoveLoop
              ((LoopDescriptor *)
               loops_to_add_remove.
               super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage,this->loop_1_);
    __end2_6 = std::
               vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
               begin((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                      *)&cfg);
    inst = (Instruction *)
           std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           ::end((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                  *)&cfg);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_6,
                              (__normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                               *)&inst), bVar3) {
      ppIVar18 = __gnu_cxx::
                 __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
                 ::operator*(&__end2_6);
      IRContext::KillInst(this->context_,*ppIVar18);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::Instruction_**,_std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>_>
      ::operator++(&__end2_6);
    }
    Function::RemoveEmptyBlocks(this->containing_function_);
    pIVar1 = this->context_;
    AVar7 = operator|(kAnalysisInstrToBlockMapping,kAnalysisLoopAnalysis);
    AVar7 = operator|(AVar7,kAnalysisBegin);
    AVar7 = operator|(AVar7,kAnalysisCFG);
    IRContext::InvalidateAnalysesExceptFor(pIVar1,AVar7);
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)&__range2_5);
    std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::~vector
              ((vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_> *)&__range2_3)
    ;
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &cfg);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    ~vector((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *)
            &__range2);
    return;
  }
  __assert_fail("IsLegal() && \"Can\'t fuse, illegal\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_fusion.cpp"
                ,0x217,"void spvtools::opt::LoopFusion::Fuse()");
}

Assistant:

void LoopFusion::Fuse() {
  assert(AreCompatible() && "Can't fuse, loops aren't compatible");
  assert(IsLegal() && "Can't fuse, illegal");

  // Save the pointers/ids, won't be found in the middle of doing modifications.
  auto header_1 = loop_1_->GetHeaderBlock()->id();
  auto condition_1 = loop_1_->FindConditionBlock()->id();
  auto continue_1 = loop_1_->GetContinueBlock()->id();
  auto continue_0 = loop_0_->GetContinueBlock()->id();
  auto condition_block_of_0 = loop_0_->FindConditionBlock();

  // Find the blocks whose branches need updating.
  auto first_block_of_1 = &*(++containing_function_->FindBlock(condition_1));
  auto last_block_of_1 = &*(--containing_function_->FindBlock(continue_1));
  auto last_block_of_0 = &*(--containing_function_->FindBlock(continue_0));

  // Update the branch for |last_block_of_loop_0| to go to |first_block_of_1|.
  last_block_of_0->ForEachSuccessorLabel(
      [first_block_of_1](uint32_t* succ) { *succ = first_block_of_1->id(); });

  // Update the branch for the |last_block_of_loop_1| to go to the continue
  // block of |loop_0_|.
  last_block_of_1->ForEachSuccessorLabel(
      [this](uint32_t* succ) { *succ = loop_0_->GetContinueBlock()->id(); });

  // Update merge block id in the header of |loop_0_| to the merge block of
  // |loop_1_|.
  loop_0_->GetHeaderBlock()->ForEachInst([this](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpLoopMerge) {
      inst->SetInOperand(0, {loop_1_->GetMergeBlock()->id()});
    }
  });

  // Update condition branch target in |loop_0_| to the merge block of
  // |loop_1_|.
  condition_block_of_0->ForEachInst([this](Instruction* inst) {
    if (inst->opcode() == spv::Op::OpBranchConditional) {
      auto loop_0_merge_block_id = loop_0_->GetMergeBlock()->id();

      if (inst->GetSingleWordInOperand(1) == loop_0_merge_block_id) {
        inst->SetInOperand(1, {loop_1_->GetMergeBlock()->id()});
      } else {
        inst->SetInOperand(2, {loop_1_->GetMergeBlock()->id()});
      }
    }
  });

  // Move OpPhi instructions not corresponding to the induction variable from
  // the header of |loop_1_| to the header of |loop_0_|.
  std::vector<Instruction*> instructions_to_move{};
  for (auto& instruction : *loop_1_->GetHeaderBlock()) {
    if (instruction.opcode() == spv::Op::OpPhi &&
        &instruction != induction_1_) {
      instructions_to_move.push_back(&instruction);
    }
  }

  for (auto& it : instructions_to_move) {
    it->RemoveFromList();
    it->InsertBefore(induction_0_);
  }

  // Update the OpPhi parents to the correct blocks in |loop_0_|.
  loop_0_->GetHeaderBlock()->ForEachPhiInst([this](Instruction* i) {
    ReplacePhiParentWith(i, loop_1_->GetPreHeaderBlock()->id(),
                         loop_0_->GetPreHeaderBlock()->id());

    ReplacePhiParentWith(i, loop_1_->GetContinueBlock()->id(),
                         loop_0_->GetContinueBlock()->id());
  });

  // Update instruction to block mapping & DefUseManager.
  for (auto& phi_instruction : instructions_to_move) {
    context_->set_instr_block(phi_instruction, loop_0_->GetHeaderBlock());
    context_->get_def_use_mgr()->AnalyzeInstUse(phi_instruction);
  }

  // Replace the uses of the induction variable of |loop_1_| with that the
  // induction variable of |loop_0_|.
  context_->ReplaceAllUsesWith(induction_1_->result_id(),
                               induction_0_->result_id());

  // Replace LCSSA OpPhi in merge block of |loop_0_|.
  loop_0_->GetMergeBlock()->ForEachPhiInst([this](Instruction* instruction) {
    context_->ReplaceAllUsesWith(instruction->result_id(),
                                 instruction->GetSingleWordInOperand(0));
  });

  // Update LCSSA OpPhi in merge block of |loop_1_|.
  loop_1_->GetMergeBlock()->ForEachPhiInst(
      [condition_block_of_0](Instruction* instruction) {
        instruction->SetInOperand(1, {condition_block_of_0->id()});
      });

  // Move the continue block of |loop_0_| after the last block of |loop_1_|.
  containing_function_->MoveBasicBlockToAfter(continue_0, last_block_of_1);

  // Gather all instructions to be killed from |loop_1_| (induction variable
  // initialisation, header, condition and continue blocks).
  std::vector<Instruction*> instr_to_delete{};
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetPreHeaderBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetHeaderBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->FindConditionBlock());
  AddInstructionsInBlock(&instr_to_delete, loop_1_->GetContinueBlock());

  // There was an additional empty block between the loops, kill that too.
  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    AddInstructionsInBlock(&instr_to_delete, loop_0_->GetMergeBlock());
  }

  // Update the CFG, so it wouldn't need invalidating.
  auto cfg = context_->cfg();

  cfg->ForgetBlock(loop_1_->GetPreHeaderBlock());
  cfg->ForgetBlock(loop_1_->GetHeaderBlock());
  cfg->ForgetBlock(loop_1_->FindConditionBlock());
  cfg->ForgetBlock(loop_1_->GetContinueBlock());

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    cfg->ForgetBlock(loop_0_->GetMergeBlock());
  }

  cfg->RemoveEdge(last_block_of_0->id(), loop_0_->GetContinueBlock()->id());
  cfg->AddEdge(last_block_of_0->id(), first_block_of_1->id());

  cfg->AddEdge(last_block_of_1->id(), loop_0_->GetContinueBlock()->id());

  cfg->AddEdge(loop_0_->GetContinueBlock()->id(),
               loop_1_->GetHeaderBlock()->id());

  cfg->AddEdge(condition_block_of_0->id(), loop_1_->GetMergeBlock()->id());

  // Update DefUseManager.
  auto def_use_mgr = context_->get_def_use_mgr();

  // Uses of labels that are in updated branches need analysing.
  def_use_mgr->AnalyzeInstUse(last_block_of_0->terminator());
  def_use_mgr->AnalyzeInstUse(last_block_of_1->terminator());
  def_use_mgr->AnalyzeInstUse(loop_0_->GetHeaderBlock()->GetLoopMergeInst());
  def_use_mgr->AnalyzeInstUse(condition_block_of_0->terminator());

  // Update the LoopDescriptor, so it wouldn't need invalidating.
  auto ld = context_->GetLoopDescriptor(containing_function_);

  // Create a copy, so the iterator wouldn't be invalidated.
  std::vector<Loop*> loops_to_add_remove{};
  for (auto child_loop : *loop_1_) {
    loops_to_add_remove.push_back(child_loop);
  }

  for (auto child_loop : loops_to_add_remove) {
    loop_1_->RemoveChildLoop(child_loop);
    loop_0_->AddNestedLoop(child_loop);
  }

  auto loop_1_blocks = loop_1_->GetBlocks();

  for (auto block : loop_1_blocks) {
    loop_1_->RemoveBasicBlock(block);
    if (block != header_1 && block != condition_1 && block != continue_1) {
      loop_0_->AddBasicBlock(block);
      if ((*ld)[block] == loop_1_) {
        ld->SetBasicBlockToLoop(block, loop_0_);
      }
    }

    if ((*ld)[block] == loop_1_) {
      ld->ForgetBasicBlock(block);
    }
  }

  loop_1_->RemoveBasicBlock(loop_1_->GetPreHeaderBlock()->id());
  ld->ForgetBasicBlock(loop_1_->GetPreHeaderBlock()->id());

  if (loop_0_->GetMergeBlock() != loop_1_->GetPreHeaderBlock()) {
    loop_0_->RemoveBasicBlock(loop_0_->GetMergeBlock()->id());
    ld->ForgetBasicBlock(loop_0_->GetMergeBlock()->id());
  }

  loop_0_->SetMergeBlock(loop_1_->GetMergeBlock());

  loop_1_->ClearBlocks();

  ld->RemoveLoop(loop_1_);

  // Kill unnecessary instructions and remove all empty blocks.
  for (auto inst : instr_to_delete) {
    context_->KillInst(inst);
  }

  containing_function_->RemoveEmptyBlocks();

  // Invalidate analyses.
  context_->InvalidateAnalysesExceptFor(
      IRContext::Analysis::kAnalysisInstrToBlockMapping |
      IRContext::Analysis::kAnalysisLoopAnalysis |
      IRContext::Analysis::kAnalysisDefUse | IRContext::Analysis::kAnalysisCFG);
}